

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtt_stats.cc
# Opt level: O0

void __thiscall quic::RttStats::OnConnectionMigration(RttStats *this)

{
  Delta DVar1;
  RttStats *this_local;
  
  DVar1 = QuicTime::Delta::Zero();
  (this->latest_rtt_).time_offset_ = DVar1.time_offset_;
  DVar1 = QuicTime::Delta::Zero();
  (this->min_rtt_).time_offset_ = DVar1.time_offset_;
  DVar1 = QuicTime::Delta::Zero();
  (this->smoothed_rtt_).time_offset_ = DVar1.time_offset_;
  DVar1 = QuicTime::Delta::Zero();
  (this->mean_deviation_).time_offset_ = DVar1.time_offset_;
  DVar1 = QuicTime::Delta::FromMilliseconds(100);
  (this->initial_rtt_).time_offset_ = DVar1.time_offset_;
  DVar1 = QuicTime::Delta::Zero();
  (this->max_ack_delay_).time_offset_ = DVar1.time_offset_;
  return;
}

Assistant:

void RttStats::OnConnectionMigration() {
  latest_rtt_ = QuicTime::Delta::Zero();
  min_rtt_ = QuicTime::Delta::Zero();
  smoothed_rtt_ = QuicTime::Delta::Zero();
  mean_deviation_ = QuicTime::Delta::Zero();
  initial_rtt_ = QuicTime::Delta::FromMilliseconds(kInitialRttMs);
  max_ack_delay_ = QuicTime::Delta::Zero();
}